

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatTest_EnumFormatterUnambiguous_Test::TestBody(FormatTest_EnumFormatterUnambiguous_Test *this)

{
  bool bVar1;
  int *in_stack_00000010;
  unsigned_long *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_00000028;
  AssertionResult gtest_ar;
  formatter<TestEnum,_char,_void> f;
  AssertionResult *this_00;
  char *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  Type in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  AssertionResult local_60 [3];
  Message *in_stack_ffffffffffffffd8;
  AssertHelper *in_stack_ffffffffffffffe0;
  
  fmt::v5::formatter<TestEnum,_char,_void>::formatter((formatter<TestEnum,_char,_void> *)0x17e1c9);
  uVar2 = 0;
  this_00 = local_60;
  testing::internal::CmpHelperGE<unsigned_long,int>
            (in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar2,in_stack_ffffffffffffff90));
    testing::AssertionResult::failure_message((AssertionResult *)0x17e249);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    testing::Message::~Message((Message *)0x17e295);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17e2e5);
  return;
}

Assistant:

TEST(FormatTest, EnumFormatterUnambiguous) {
  fmt::formatter<TestEnum> f;
  ASSERT_GE(sizeof(f), 0); // use f to avoid compiler warning
}